

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_lev.c
# Opt level: O0

void lvlfill_solid(level *lev,schar filling,schar lit)

{
  uint uVar1;
  int local_1c;
  int local_18;
  int y;
  int x;
  schar lit_local;
  schar filling_local;
  level *lev_local;
  
  for (local_18 = 2; local_18 <= x_maze_max; local_18 = local_18 + 1) {
    for (local_1c = 0; local_1c <= y_maze_max; local_1c = local_1c + 1) {
      if (filling < '\'') {
        lev->locations[local_18][local_1c].typ = filling;
      }
      if (filling == '\x15') {
        *(uint *)&lev->locations[local_18][local_1c].field_0x6 =
             *(uint *)&lev->locations[local_18][local_1c].field_0x6 & 0xfffffbff | 0x400;
      }
      else if (lit != -2) {
        if (lit == -1) {
          uVar1 = rn2(2);
          *(uint *)&lev->locations[local_18][local_1c].field_0x6 =
               *(uint *)&lev->locations[local_18][local_1c].field_0x6 & 0xfffffbff |
               (uVar1 & 1) << 10;
        }
        else {
          *(uint *)&lev->locations[local_18][local_1c].field_0x6 =
               *(uint *)&lev->locations[local_18][local_1c].field_0x6 & 0xfffffbff |
               ((int)lit & 1U) << 10;
        }
      }
    }
  }
  return;
}

Assistant:

static void lvlfill_solid(struct level *lev, schar filling, schar lit)
{
	int x, y;

	for (x = 2; x <= x_maze_max; x++) {
	    for (y = 0; y <= y_maze_max; y++) {
		SET_TYPLIT(lev, x, y, filling, lit);
	    }
	}
}